

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O1

void __thiscall
TI::TMS::SpriteFetcher<(TI::TMS::Personality)4,_(TI::TMS::SpriteMode)0>::fetch_image
          (SpriteFetcher<(TI::TMS::Personality)4,_(TI::TMS::SpriteMode)0> *this,int slot,
          uint8_t name)

{
  int *piVar1;
  byte bVar2;
  Base<(TI::TMS::Personality)4> *pBVar3;
  iterator pvVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  
  pBVar3 = this->base;
  pvVar4 = pBVar3->fetch_sprite_buffer_;
  bVar2 = (pBVar3->ram_)._M_elems
          [(pvVar4->active_sprites[slot].index << 2 | 0xff83U) &
           (uint)pBVar3->sprite_attribute_table_address_];
  pvVar4->active_sprites[slot].image[2] = bVar2;
  piVar1 = &pvVar4->active_sprites[slot].x;
  *piVar1 = *piVar1 - (bVar2 >> 2 & 0x20);
  uVar5 = (ulong)(((int)CONCAT71(in_register_00000011,name) << 3 | pvVar4->active_sprites[slot].row
                  | 0xf800U) & (uint)this->base->sprite_generator_table_address_);
  pvVar4->active_sprites[slot].image[0] = (this->base->ram_)._M_elems[uVar5];
  pvVar4->active_sprites[slot].image[1] = (this->base->ram_)._M_elems[uVar5 + 0x10];
  if (slot == 3) {
    this->base->fetch_sprite_buffer_->is_filling = false;
  }
  return;
}

Assistant:

void fetch_image(int slot, uint8_t name) {
			uint8_t colour = 0;
			auto &sprite = base->fetch_sprite_buffer_->active_sprites[slot];
			switch(mode) {
				case SpriteMode::Mode1:
					// Fetch colour from the attribute table, per this sprite's slot.
					colour = base->ram_[
						base->sprite_attribute_table_address_ & bits<7>(AddressT((sprite.index << 2) | 3))
					];
				break;

				case SpriteMode::Mode2: {
					// Fetch colour from the colour table, per this sprite's slot and row.
					const AddressT colour_table_address = (base->sprite_attribute_table_address_ | ~AttributeAddressMask) & AddressT(~0x200);
					colour = base->ram_[
						colour_table_address &
						bits<9>(
							AddressT(sprite.index << 4) |
							AddressT(sprite.row)
						)
					];
				} break;
			}
			sprite.image[2] = colour;
			sprite.x -= sprite.early_clock();

			const AddressT graphic_location = base->sprite_generator_table_address_ & bits<11>(AddressT((name << 3) | sprite.row));
			sprite.image[0] = base->ram_[graphic_location];
			sprite.image[1] = base->ram_[graphic_location+16];

			if constexpr (SpriteBuffer::test_is_filling) {
				if(slot == ((mode == SpriteMode::Mode2) ? 7 : 3)) {
					base->fetch_sprite_buffer_->is_filling = false;
				}
			}
		}